

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu_p.h
# Opt level: O3

bool __thiscall QMenuPrivate::considerAction(QMenuPrivate *this,QAction *action)

{
  QWidget *this_00;
  char cVar1;
  int iVar2;
  QStyle *pQVar3;
  bool bVar4;
  
  if (action != (QAction *)0x0) {
    this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
    cVar1 = QAction::isSeparator();
    if (cVar1 == '\0') {
      cVar1 = QAction::isEnabled();
      bVar4 = true;
      if (cVar1 == '\0') {
        pQVar3 = QWidget::style(this_00);
        iVar2 = (**(code **)(*(long *)pQVar3 + 0xf0))(pQVar3,0xe,0,this_00,0);
        bVar4 = iVar2 != 0;
      }
    }
    else {
      bVar4 = false;
    }
    return bVar4;
  }
  return false;
}

Assistant:

bool considerAction(const QAction *action) const
    {
        Q_Q(const QMenu);
        if (!action || action->isSeparator())
            return false;
        if (action->isEnabled())
            return true;
        return q->style()->styleHint(QStyle::SH_Menu_AllowActiveAndDisabled, nullptr, q);
    }